

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O1

uv_loop_t * uv_loop_new(void)

{
  int iVar1;
  uv_loop_t *loop;
  
  loop = (uv_loop_t *)malloc(0x2d0);
  if (loop != (uv_loop_t *)0x0) {
    iVar1 = uv__loop_init(loop,0);
    if (iVar1 == 0) {
      return loop;
    }
    free(loop);
  }
  return (uv_loop_t *)0x0;
}

Assistant:

uv_loop_t* uv_loop_new(void) {
  uv_loop_t* loop;

  loop = malloc(sizeof(*loop));
  if (loop == NULL)
    return NULL;

  if (uv__loop_init(loop, /* default_loop? */ 0)) {
    free(loop);
    return NULL;
  }

  return loop;
}